

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam_hdr_t * bam_hdr_dup(bam_hdr_t *h0)

{
  uint uVar1;
  uint32_t *puVar2;
  char **ppcVar3;
  bam_hdr_t *pbVar4;
  char *pcVar5;
  uint32_t *puVar6;
  char **ppcVar7;
  size_t sVar8;
  size_t __nmemb;
  
  if ((h0 == (bam_hdr_t *)0x0) || (pbVar4 = (bam_hdr_t *)calloc(1,0x38), pbVar4 == (bam_hdr_t *)0x0)
     ) {
    pbVar4 = (bam_hdr_t *)0x0;
  }
  else {
    __nmemb = (size_t)h0->n_targets;
    pbVar4->n_targets = h0->n_targets;
    pbVar4->ignore_sam_err = h0->ignore_sam_err;
    uVar1 = h0->l_text;
    pbVar4->l_text = uVar1;
    pbVar4->cigar_tab = (int8_t *)0x0;
    pbVar4->sdict = (void *)0x0;
    pcVar5 = (char *)calloc((ulong)(uVar1 + 1),1);
    pbVar4->text = pcVar5;
    memcpy(pcVar5,h0->text,(ulong)uVar1);
    puVar6 = (uint32_t *)calloc(__nmemb,4);
    pbVar4->target_len = puVar6;
    ppcVar7 = (char **)calloc(__nmemb,8);
    pbVar4->target_name = ppcVar7;
    if (0 < (long)__nmemb) {
      puVar2 = h0->target_len;
      ppcVar3 = h0->target_name;
      sVar8 = 0;
      do {
        puVar6[sVar8] = puVar2[sVar8];
        pcVar5 = strdup(ppcVar3[sVar8]);
        ppcVar7[sVar8] = pcVar5;
        sVar8 = sVar8 + 1;
      } while (__nmemb != sVar8);
    }
  }
  return pbVar4;
}

Assistant:

bam_hdr_t *bam_hdr_dup(const bam_hdr_t *h0)
{
    if (h0 == NULL) return NULL;
    bam_hdr_t *h;
    if ((h = bam_hdr_init()) == NULL) return NULL;
    // copy the simple data
    h->n_targets = h0->n_targets;
    h->ignore_sam_err = h0->ignore_sam_err;
    h->l_text = h0->l_text;
    // Then the pointery stuff
    h->cigar_tab = NULL;
    h->sdict = NULL;
    h->text = (char*)calloc(h->l_text + 1, 1);
    memcpy(h->text, h0->text, h->l_text);
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    int i;
    for (i = 0; i < h->n_targets; ++i) {
        h->target_len[i] = h0->target_len[i];
        h->target_name[i] = strdup(h0->target_name[i]);
    }
    return h;
}